

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simdgroupsimple.h
# Opt level: O2

void FastPForLib::SIMDGroupSimple<false,_false>::encodeArrayInternal_woRingBuf
               (uint32_t *in,size_t len,uint32_t *out,size_t *nvalue)

{
  __m128i *palVar1;
  undefined1 auVar2 [16];
  byte bVar3;
  uint uVar4;
  int iVar5;
  void *pvVar6;
  bool bVar7;
  ulong uVar8;
  ulong uVar9;
  uint32_t *puVar10;
  long lVar11;
  byte bVar12;
  long lVar13;
  uint32_t *puVar14;
  ulong uVar15;
  __m128i *palVar16;
  undefined1 auVar17 [16];
  uint8_t countQuadsLastBlock;
  uint8_t local_79;
  __m128i *outDataArea128;
  long local_70;
  uint32_t *local_68;
  long local_60;
  byte *local_58;
  size_t local_50;
  uint32_t *local_48;
  ulong *local_40;
  __m128i *in128;
  
  uVar15 = len >> 2 & 0xfffffffffffffff;
  local_40 = nvalue;
  pvVar6 = operator_new__(uVar15 * 4);
  for (uVar8 = 0; uVar8 < len; uVar8 = uVar8 + 4) {
    auVar17._8_8_ = *(undefined8 *)(in + uVar8 + 2);
    auVar17._0_8_ = *(undefined8 *)(in + uVar8 + 2);
    auVar17 = vorps_avx(auVar17,*(undefined1 (*) [16])(in + uVar8));
    auVar2 = vshufps_avx(auVar17,auVar17,0x55);
    auVar17 = vorps_avx(auVar17,auVar2);
    *(int *)((long)pvVar6 + uVar8) = auVar17._0_4_;
  }
  local_68 = out + 3;
  bVar7 = true;
  uVar8 = 0;
  lVar11 = 0;
  puVar10 = local_68;
  do {
    if (uVar15 == 0) {
      countQuadsLastBlock = (uint8_t)uVar8;
      uVar8 = (ulong)((byte)~bVar7 & 1);
      palVar16 = (__m128i *)((long)puVar10 + uVar8 + 1);
      *(uint8_t *)((long)palVar16[-1] + 0xf) = countQuadsLastBlock;
      local_48 = out;
      operator_delete__(pvVar6);
      local_58 = (byte *)((long)puVar10 + (uVar8 - (long)local_68));
      local_70 = (long)local_58 * 2 - uVar8;
      uVar4 = (int)local_58 + 0xdU & 0xf;
      local_60 = 0;
      if (uVar4 != 0) {
        local_60 = 0x10 - (ulong)uVar4;
      }
      palVar1 = (__m128i *)((long)puVar10 + local_60 + 1 + uVar8);
      for (; palVar16 < palVar1; palVar16 = (__m128i *)((long)*palVar16 + 1)) {
        *(byte *)*palVar16 = 0;
      }
      iVar5 = (int)local_70;
      outDataArea128 = palVar1;
      local_50 = len;
      in128 = (__m128i *)in;
      for (uVar8 = 0; (long)uVar8 < (long)(iVar5 + -1); uVar8 = uVar8 + 1) {
        bVar12 = *(byte *)((long)local_68 + (uVar8 >> 1));
        bVar3 = bVar12 >> 4;
        if ((uVar8 & 1) == 0) {
          bVar3 = bVar12 & 0xf;
        }
        local_79 = (&SIMDGroupSimple<false,false>::tableNum)[bVar3];
        comprCompleteBlock(&local_79,&in128,&outDataArea128);
      }
      if (countQuadsLastBlock != '\0') {
        comprIncompleteBlock(&countQuadsLastBlock,&in128,&outDataArea128);
      }
      *local_48 = (uint32_t)local_50;
      local_48[1] = (uint32_t)local_70;
      local_48[2] = (uint32_t)local_58;
      *local_40 = (ulong)((((int)local_60 + (uint32_t)local_58) - (int)palVar1) + 0x10 +
                          (int)outDataArea128 >> 2);
      return;
    }
    for (lVar13 = 0; lVar13 != 10; lVar13 = lVar13 + 1) {
      uVar8 = (ulong)(byte)(&SIMDGroupSimple<false,false>::tableNum)[lVar13];
      if (uVar15 < (byte)(&SIMDGroupSimple<false,false>::tableNum)[lVar13]) {
        uVar8 = uVar15;
      }
      uVar9 = 0;
      while( true ) {
        if (uVar8 == uVar9) goto LAB_00126da5;
        if ((uint)(&SIMDGroupSimple<false,false>::tableMask)[lVar13] <
            *(uint *)((long)pvVar6 + uVar9 * 4 + lVar11 * 4)) break;
        uVar9 = uVar9 + 1;
      }
      if (uVar8 == uVar9) goto LAB_00126da5;
      uVar8 = uVar9;
    }
    lVar13 = 10;
LAB_00126da5:
    bVar12 = (byte)lVar13;
    puVar14 = puVar10;
    if (!bVar7) {
      bVar12 = bVar12 << 4 | (byte)*puVar10;
      puVar14 = (uint32_t *)((long)puVar10 + 1);
    }
    *(byte *)puVar10 = bVar12;
    uVar15 = uVar15 - uVar8;
    lVar11 = lVar11 + uVar8;
    bVar7 = (bool)(bVar7 ^ 1);
    puVar10 = puVar14;
  } while( true );
}

Assistant:

inline static void encodeArrayInternal_woRingBuf(const uint32_t *in,
                                                         const size_t len,
                                                         uint32_t *out,
                                                         size_t &nvalue) {
            // The start of the header.
            uint32_t *const outHeader32 = out;
            // The start of the selectors area.
            uint8_t *outSelArea8 =
                    reinterpret_cast<uint8_t *>(outHeader32 + countHeader32);
            uint8_t *const initOutSelArea8 = outSelArea8;

            // The number of input quads, i.e., groups of four integers. Note that we
            // assume the number of input integers to be a multiple of four.
            const size_t countIn128 = len * sizeof(uint32_t) / sizeof(__m128i);

            // Step 1: Generation of the quad max array
            // ========================================
            uint32_t *quadMaxArray = new uint32_t[countIn128];
            for (size_t i = 0; i < len; i += 4) {
                const uint32_t pseudoQuadMax = in[i] | in[i + 1] | in[i + 2] | in[i + 3];
                quadMaxArray[i >> 2] = pseudoQuadMax;
            }

            // Step 2: Pattern selection algorithm
            // ===================================
            // As described in the paper.
            size_t l = countIn128;
            size_t j = 0;
            size_t pos = 0;
            // Whether we have an even number of selectors so far.
            bool even = true;
            while (l > 0) {
                uint8_t i;
                for (i = 0; i <= 9; i++) {
                    const uint8_t n = tableNum[i];
                    // Unlike the original pattern selection algorithm, we look up the mask
                    // directly instead of calculating it from a looked up bit width.
                    const uint32_t mask = tableMask[i];
                    pos = 0;
                    const size_t maxPos = std::min(static_cast<size_t>(n), l);
                    while (pos < maxPos && quadMaxArray[j + pos] <= mask)
                        pos++;
                    if (pos == maxPos)
                        break;
                }
                l -= pos;
                j += pos;
                // Store the selector.
                if (even)
                    *outSelArea8 = i;
                else
                    *outSelArea8++ |= (i << 4);
                even = !even;
            }
            if (!even)
                // The last used byte in the selectors area was touched, but not finished.
                outSelArea8++;
            // The number of quads in the last block.
            const uint8_t countQuadsLastBlock = static_cast<uint8_t>(pos);
            *outSelArea8 = countQuadsLastBlock;

            delete[] quadMaxArray;

            // The number of bytes actually used for the selectors area.
            const size_t countSelArea8Used = outSelArea8 - initOutSelArea8;
            // The total number of selectors.
            const int countSels = int(countSelArea8Used * 2 - (even ? 0 : 1));

            // The number of bytes that could be required for the selectors area in the
            // worst case.
            const size_t countSelArea8WorstCase = countIn128 / 2 + (countIn128 & 1);

            // Depending on whether we want to leave the "pessimistic gap" between the
            // selectors area and the data area, we either reserve the true or the
            // worst-case number of bytes for the selectors area. Note that this has no
            // effect on the amount of data that we actually have to write.
            const size_t countSelArea8 =
                    pessimisticGap ? countSelArea8WorstCase : countSelArea8Used;

            const size_t countPadBytes = getCountPadBytes(countSelArea8);
            // The start of the data area.
            __m128i *outDataArea128 = reinterpret_cast<__m128i *>(initOutSelArea8 +
                                                                  countSelArea8 + sizeof(uint8_t) + countPadBytes);
            const __m128i *const initOutDataArea128 = outDataArea128;
            uint8_t *pad8 = (uint8_t *) outDataArea128 - countPadBytes;
            while (pad8 < (uint8_t *) outDataArea128)
                *pad8++ = 0; // clear padding bytes

            const __m128i *in128 = reinterpret_cast<const __m128i *>(in);

            // Step 3: Packing the uncompressed integers
            // =========================================
            // Iterate over the selectors obtained from the pattern selection algorithm
            // and compress the blocks accordingly. The last block is always treated
            // specially, since it might not be "full".
            for (int m = 0; m < countSels - 1; m++) {
                const uint8_t i = extractSel(initOutSelArea8, m);
                const size_t n = tableNum[i];
                comprCompleteBlock(uint8_t(n), in128, outDataArea128);
            }
            if (countQuadsLastBlock)
                comprIncompleteBlock(countQuadsLastBlock, in128, outDataArea128);

            // Write some meta data to the header.
            outHeader32[0] = uint32_t(len);
            outHeader32[1] = uint32_t(countSels);
            outHeader32[2] = uint32_t(countSelArea8);

            // The position of the last byte written to the output relative to the
            // start of the output. Note that the actual number of written bytes might
            // be slightly lower due to the inserted padding. However, it might even be
            // significantly lower, if pessimisticGap is true.
            const size_t nbytes = countHeader32 * sizeof(uint32_t) +
                                  countSelArea8 + sizeof(uint8_t) + countPadBytes +
                                  (outDataArea128 - initOutDataArea128) * sizeof(__m128i);
            // Rounding the number of bytes to full 32-bit integers.
            nvalue = div_roundup(uint32_t(nbytes), sizeof(uint32_t));
        }